

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O1

void helics::integerExtractAndConvert
               (defV *store,data_view *dv,shared_ptr<units::precise_unit> *inputUnits,
               shared_ptr<units::precise_unit> *outputUnits)

{
  element_type *this;
  precise_unit *start;
  precise_unit *result;
  long V;
  long local_30;
  double local_28;
  
  detail::convertFromBinary((byte *)(dv->dblock)._M_str,&local_30);
  this = (inputUnits->super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((this == (element_type *)0x0) ||
     (start = (outputUnits->super___shared_ptr<units::precise_unit,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr, start == (precise_unit *)0x0)) {
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)store,&local_30);
  }
  else {
    local_28 = ::units::convert<units::precise_unit,units::precise_unit>
                         ((units *)this,(double)local_30,start,result);
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)store,&local_28);
  }
  return;
}

Assistant:

void integerExtractAndConvert(defV& store,
                              const data_view& dv,
                              const std::shared_ptr<units::precise_unit>& inputUnits,
                              const std::shared_ptr<units::precise_unit>& outputUnits)
{
    auto V = ValueConverter<int64_t>::interpret(dv);
    if ((inputUnits) && (outputUnits)) {
        store = units::convert(static_cast<double>(V), *inputUnits, *outputUnits);
    } else {
        store = V;
    }
}